

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall HEkk::computeDualSteepestEdgeWeights(HEkk *this,bool initial)

{
  reference pvVar1;
  byte in_SIL;
  HighsSimplexAnalysis *in_RDI;
  HighsLogOptions *log_options_;
  double IzDseWtTT;
  HighsInt iRow;
  HVector row_ep;
  HighsInt num_row;
  HVectorBase<double> *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  HighsSimplexAnalysis *this_00;
  undefined8 in_stack_ffffffffffffff28;
  int iVar2;
  undefined4 in_stack_ffffffffffffff34;
  uint local_10;
  byte local_9;
  
  local_9 = in_SIL & 1;
  if ((in_RDI->devex_iteration_count & 0x1000000) != 0) {
    HighsSimplexAnalysis::simplexTimerStart
              (in_RDI,(HighsInt)((ulong)in_stack_ffffffffffffff18 >> 0x20),
               (HighsInt)in_stack_ffffffffffffff18);
    HighsSimplexAnalysis::simplexTimerStart
              (in_RDI,(HighsInt)((ulong)in_stack_ffffffffffffff18 >> 0x20),
               (HighsInt)in_stack_ffffffffffffff18);
  }
  local_10 = *(uint *)((long)&in_RDI[1].thread_simplex_clocks.
                              super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  this_00 = (HighsSimplexAnalysis *)&stack0xffffffffffffff40;
  HVectorBase<double>::HVectorBase(in_stack_ffffffffffffff10);
  HVectorBase<double>::setup((HVectorBase<double> *)in_RDI,(HighsInt)((ulong)this_00 >> 0x20));
  for (iVar2 = 0; iVar2 < (int)local_10; iVar2 = iVar2 + 1) {
    in_stack_ffffffffffffff10 =
         (HVectorBase<double> *)
         computeDualSteepestEdgeWeight
                   ((HEkk *)CONCAT44(in_stack_ffffffffffffff34,iVar2),
                    (HighsInt)((ulong)in_stack_ffffffffffffff28 >> 0x20),(HVector *)in_RDI);
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &in_RDI[1].max_correct_dual_cost_shift_dual_infeasibility,(long)iVar2);
    *pvVar1 = (value_type)in_stack_ffffffffffffff10;
  }
  if ((in_RDI->devex_iteration_count & 0x1000000) != 0) {
    HighsSimplexAnalysis::simplexTimerStop
              (in_RDI,(HighsInt)((ulong)this_00 >> 0x20),(HighsInt)this_00);
    HighsSimplexAnalysis::simplexTimerStop
              (in_RDI,(HighsInt)((ulong)this_00 >> 0x20),(HighsInt)this_00);
    if ((local_9 & 1) != 0) {
      log_options_ = (HighsLogOptions *)
                     HighsSimplexAnalysis::simplexTimerRead
                               (this_00,(HighsInt)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                                (HighsInt)in_stack_ffffffffffffff10);
      highsLogDev(log_options_,
                  (HighsLogType)
                  ((in_RDI->thread_simplex_clocks).
                   super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>._M_impl.
                   super__Vector_impl_data._M_start + 0x1c),(char *)0x2,
                  "Computed %d initial DSE weights in %gs\n",(ulong)local_10);
    }
  }
  HVectorBase<double>::~HVectorBase(in_stack_ffffffffffffff10);
  return;
}

Assistant:

void HEkk::computeDualSteepestEdgeWeights(const bool initial) {
  if (analysis_.analyse_simplex_time) {
    analysis_.simplexTimerStart(SimplexIzDseWtClock);
    analysis_.simplexTimerStart(DseIzClock);
  }
  const HighsInt num_row = lp_.num_row_;
  HVector row_ep;
  row_ep.setup(num_row);
  assert((HighsInt)dual_edge_weight_.size() >= num_row);
  for (HighsInt iRow = 0; iRow < num_row; iRow++)
    dual_edge_weight_[iRow] = computeDualSteepestEdgeWeight(iRow, row_ep);
  if (analysis_.analyse_simplex_time) {
    analysis_.simplexTimerStop(SimplexIzDseWtClock);
    analysis_.simplexTimerStop(DseIzClock);
    if (initial) {
      double IzDseWtTT = analysis_.simplexTimerRead(SimplexIzDseWtClock);
      highsLogDev(options_->log_options, HighsLogType::kDetailed,
                  "Computed %" HIGHSINT_FORMAT " initial DSE weights in %gs\n",
                  num_row, IzDseWtTT);
    }
  }
}